

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::CreateDragClone(Context *this,Element *element)

{
  ElementDocument *this_00;
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  ElementDocument *pEVar4;
  Element *pEVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  allocator<char> local_b1;
  ElementPtr element_drag_clone;
  Vector2f projected_mouse_position;
  ElementPtr local_a0;
  Property local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  __shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
      _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == (Element *)0x0) {
    bVar3 = Assert("Unable to create drag clone, no cursor proxy document.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                   ,0x4df);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  ReleaseDragClone(this);
  Element::Clone((Element *)&element_drag_clone);
  if ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)
      element_drag_clone._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
      .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0) {
    Log::Message(LT_ERROR,"Unable to duplicate drag clone.");
  }
  else {
    pEVar4 = Element::GetOwnerDocument(element);
    if (pEVar4 != (ElementDocument *)0x0) {
      this_00 = (ElementDocument *)
                (this->cursor_proxy)._M_t.
                super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
      ::std::__shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,
                 &(pEVar4->style_sheet_container).
                  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>);
      ElementDocument::SetStyleSheetContainer(this_00,(SharedPtr<StyleSheetContainer> *)&local_30);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
    this->drag_clone =
         (Element *)
         element_drag_clone._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
         _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    local_a0 = (ElementPtr)
               (ElementPtr)
               element_drag_clone._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    element_drag_clone._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
    Element::AppendChild
              ((this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,&local_a0,true);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_a0);
    VVar2 = Element::GetAbsoluteOffset(element,Border);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._M_allocated_capacity._0_4_ = VVar2.x;
    local_48._M_allocated_capacity._4_4_ = VVar2.y;
    local_48._12_4_ = extraout_XMM0_Dd;
    projected_mouse_position.y = (float)(this->mouse_position).y;
    projected_mouse_position.x = (float)(this->mouse_position).x;
    pEVar5 = Element::GetParentNode(element);
    if (pEVar5 != (Element *)0x0) {
      Element::Project(pEVar5,&projected_mouse_position);
    }
    pEVar5 = this->drag_clone;
    Property::Property<Rml::Style::Position,Rml::Style::Position>(&local_98,Absolute);
    Element::SetProperty(pEVar5,Position,&local_98);
    Property::~Property(&local_98);
    pEVar5 = this->drag_clone;
    Property::Property<float>
              (&local_98,(float)local_48._M_allocated_capacity._0_4_ - projected_mouse_position.x,PX
               ,-1);
    Element::SetProperty(pEVar5,Left,&local_98);
    Property::~Property(&local_98);
    pEVar5 = this->drag_clone;
    Property::Property<float>
              (&local_98,(float)local_48._M_allocated_capacity._4_4_ - projected_mouse_position.y,PX
               ,-1);
    Element::SetProperty(pEVar5,Top,&local_98);
    Property::~Property(&local_98);
    pEVar5 = this->drag_clone;
    Property::Property<float>(&local_98,0.0,PX,-1);
    Element::SetProperty(pEVar5,MarginLeft,&local_98);
    Property::~Property(&local_98);
    pEVar5 = this->drag_clone;
    Property::Property<float>(&local_98,0.0,PX,-1);
    Element::SetProperty(pEVar5,MarginTop,&local_98);
    Property::~Property(&local_98);
    pEVar5 = this->drag_clone;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"drag",&local_b1);
    Element::SetPseudoClass(pEVar5,(String *)&local_98,true);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&element_drag_clone);
  return;
}

Assistant:

void Context::CreateDragClone(Element* element)
{
	RMLUI_ASSERTMSG(cursor_proxy, "Unable to create drag clone, no cursor proxy document.");

	ReleaseDragClone();

	// Instance the drag clone.
	ElementPtr element_drag_clone = element->Clone();
	if (!element_drag_clone)
	{
		Log::Message(Log::LT_ERROR, "Unable to duplicate drag clone.");
		return;
	}

	// Set the style sheet on the cursor proxy.
	if (ElementDocument* document = element->GetOwnerDocument())
	{
		// Borrow the target document's style sheet. Sharing style sheet containers should be used with care, and
		// only within the same context.
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(document->style_sheet_container);
	}

	drag_clone = element_drag_clone.get();

	// Append the clone to the cursor proxy element.
	cursor_proxy->AppendChild(std::move(element_drag_clone));

	// Position the clone. Use projected mouse coordinates to handle any ancestor transforms.
	const Vector2f absolute_pos = element->GetAbsoluteOffset(BoxArea::Border);
	Vector2f projected_mouse_position = Vector2f(mouse_position);
	if (Element* parent = element->GetParentNode())
		parent->Project(projected_mouse_position);

	drag_clone->SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
	drag_clone->SetProperty(PropertyId::Left, Property(absolute_pos.x - projected_mouse_position.x, Unit::PX));
	drag_clone->SetProperty(PropertyId::Top, Property(absolute_pos.y - projected_mouse_position.y, Unit::PX));
	// We remove margins so that percentage- and auto-margins are evaluated correctly.
	drag_clone->SetProperty(PropertyId::MarginLeft, Property(0.f, Unit::PX));
	drag_clone->SetProperty(PropertyId::MarginTop, Property(0.f, Unit::PX));
	drag_clone->SetPseudoClass("drag", true);
}